

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall
Reducer::Reducer(Reducer *this,string *command,string *test,string *working,bool binary,bool deNan,
                bool verbose,bool debugInfo,ToolOptions *toolOptions)

{
  pointer pcVar1;
  
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.stack.usedFixed = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task,_std::allocator<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
           ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
           super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task,_std::allocator<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
           ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
           super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task,_std::allocator<wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currFunction =
       (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule = (Module *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__Reducer_00139cb8;
  (this->command)._M_dataplus._M_p = (pointer)&(this->command).field_2;
  pcVar1 = (command->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->command,pcVar1,pcVar1 + command->_M_string_length);
  (this->test)._M_dataplus._M_p = (pointer)&(this->test).field_2;
  pcVar1 = (test->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->test,pcVar1,pcVar1 + test->_M_string_length);
  (this->working)._M_dataplus._M_p = (pointer)&(this->working).field_2;
  pcVar1 = (working->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->working,pcVar1,pcVar1 + working->_M_string_length);
  this->binary = binary;
  this->deNan = deNan;
  this->verbose = verbose;
  this->debugInfo = debugInfo;
  this->toolOptions = toolOptions;
  this->decisionCounter = 0;
  (this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = (Module *)0x0;
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  return;
}

Assistant:

Reducer(std::string command,
          std::string test,
          std::string working,
          bool binary,
          bool deNan,
          bool verbose,
          bool debugInfo,
          ToolOptions& toolOptions)
    : command(command), test(test), working(working), binary(binary),
      deNan(deNan), verbose(verbose), debugInfo(debugInfo),
      toolOptions(toolOptions) {}